

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O2

void TestCompare(void)

{
  bool bVar1;
  uint uVar2;
  undefined1 uVar3;
  int in_R9D;
  Bignum bignum2;
  Bignum bignum1;
  
  bignum1.used_bigits_ = 0;
  bignum1.exponent_ = 0;
  bignum2.used_bigits_ = 0;
  bignum2.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&bignum1,1);
  double_conversion::Bignum::AssignUInt16(&bignum2,1);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  uVar3 = 0xbd;
  CheckEqualsHelper((char *)0x431,0xc1672e,(char *)0x0,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  bVar1 = double_conversion::Bignum::Equal(&bignum1,&bignum2);
  CheckHelper((char *)0x432,0xc0c446,(char *)(ulong)bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::LessEqual(&bignum1,&bignum2);
  CheckHelper((char *)0x433,0xc0c3df,(char *)(ulong)bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::Less(&bignum1,&bignum2);
  CheckHelper((char *)0x434,0xc0c403,(char *)(ulong)!bVar1,(bool)uVar3);
  double_conversion::Bignum::AssignUInt16(&bignum1,0);
  double_conversion::Bignum::AssignUInt16(&bignum2,1);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x438,0xc16098,(char *)0xffffffffffffffff,0xc0c3bd,(char *)(ulong)uVar2,
                    in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  uVar3 = 0x23;
  CheckEqualsHelper((char *)0x439,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  bVar1 = double_conversion::Bignum::Equal(&bignum1,&bignum2);
  CheckHelper((char *)0x43a,0xc0c445,(char *)(ulong)!bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::Equal(&bignum2,&bignum1);
  CheckHelper((char *)0x43b,0xc0c466,(char *)(ulong)!bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::LessEqual(&bignum1,&bignum2);
  CheckHelper((char *)0x43c,0xc0c3df,(char *)(ulong)bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::LessEqual(&bignum2,&bignum1);
  CheckHelper((char *)0x43d,0xc0c487,(char *)(ulong)!bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::Less(&bignum1,&bignum2);
  CheckHelper((char *)0x43e,0xc0c404,(char *)(ulong)bVar1,(bool)uVar3);
  bVar1 = double_conversion::Bignum::Less(&bignum2,&bignum1);
  CheckHelper((char *)0x43f,0xc0c4ac,(char *)(ulong)!bVar1,(bool)uVar3);
  AssignHexString(&bignum1,"1234567890ABCDEF12345");
  AssignHexString(&bignum2,"1234567890ABCDEF12345");
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x443,0xc1672e,(char *)0x0,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"1234567890ABCDEF12345");
  AssignHexString(&bignum2,"1234567890ABCDEF12346");
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x447,0xc16098,(char *)0xffffffff,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x448,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"1234567890ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&bignum1,500);
  AssignHexString(&bignum2,"1234567890ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&bignum2,500);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x44e,0xc1672e,(char *)0x0,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"1234567890ABCDEF12345");
  double_conversion::Bignum::ShiftLeft(&bignum1,500);
  AssignHexString(&bignum2,"1234567890ABCDEF12346");
  double_conversion::Bignum::ShiftLeft(&bignum2,500);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x454,0xc16098,(char *)0xffffffff,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x455,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  double_conversion::Bignum::AssignUInt16(&bignum1,1);
  double_conversion::Bignum::ShiftLeft(&bignum1,0x40);
  AssignHexString(&bignum2,"10000000000000000");
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x45a,0xc1672e,(char *)0x0,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x45b,0xc1672e,(char *)0x0,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  double_conversion::Bignum::AssignUInt16(&bignum1,1);
  double_conversion::Bignum::ShiftLeft(&bignum1,0x40);
  AssignHexString(&bignum2,"10000000000000001");
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x460,0xc16098,(char *)0xffffffff,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x461,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  double_conversion::Bignum::AssignUInt16(&bignum1,1);
  double_conversion::Bignum::ShiftLeft(&bignum1,0x60);
  AssignHexString(&bignum2,"10000000000000001");
  double_conversion::Bignum::ShiftLeft(&bignum2,0x20);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x467,0xc16098,(char *)0xffffffff,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x468,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"FFFFFFFFFFFFFFFF");
  double_conversion::Bignum::AssignUInt16(&bignum2,1);
  double_conversion::Bignum::ShiftLeft(&bignum2,0x40);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x46d,0xc16098,(char *)0xffffffffffffffff,0xc0c3bd,(char *)(ulong)uVar2,
                    in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x46e,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"FFFFFFFFFFFFFFFF");
  double_conversion::Bignum::ShiftLeft(&bignum1,0x20);
  double_conversion::Bignum::AssignUInt16(&bignum2,1);
  double_conversion::Bignum::ShiftLeft(&bignum2,0x60);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x474,0xc16098,(char *)0xffffffffffffffff,0xc0c3bd,(char *)(ulong)uVar2,
                    in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x475,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"FFFFFFFFFFFFFFFF");
  double_conversion::Bignum::ShiftLeft(&bignum1,0x20);
  double_conversion::Bignum::AssignUInt16(&bignum2,1);
  double_conversion::Bignum::ShiftLeft(&bignum2,0x5f);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x47b,0xc16050,(char *)0x1,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x47c,0xc16098,(char *)0xffffffff,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"FFFFFFFFFFFFFFFF");
  double_conversion::Bignum::ShiftLeft(&bignum1,0x20);
  double_conversion::Bignum::AssignUInt16(&bignum2,1);
  double_conversion::Bignum::ShiftLeft(&bignum2,100);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x482,0xc16098,(char *)0xffffffff,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x483,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"100000000000000");
  double_conversion::Bignum::AssignUInt16(&bignum2,1);
  double_conversion::Bignum::ShiftLeft(&bignum2,0x38);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x488,0xc1672e,(char *)0x0,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x489,0xc1672e,(char *)0x0,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"100000000000001");
  double_conversion::Bignum::AssignUInt16(&bignum2,1);
  double_conversion::Bignum::ShiftLeft(&bignum2,0x38);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x48e,0xc16050,(char *)0x1,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x48f,0xc16098,(char *)0xffffffff,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  AssignHexString(&bignum1,"200000000000000");
  double_conversion::Bignum::AssignUInt16(&bignum2,3);
  double_conversion::Bignum::ShiftLeft(&bignum2,0x38);
  uVar2 = double_conversion::Bignum::Compare(&bignum1,&bignum2);
  CheckEqualsHelper((char *)0x494,0xc16098,(char *)0xffffffff,0xc0c3bd,(char *)(ulong)uVar2,in_R9D);
  uVar2 = double_conversion::Bignum::Compare(&bignum2,&bignum1);
  CheckEqualsHelper((char *)0x495,0xc16050,(char *)0x1,0xc0c423,(char *)(ulong)uVar2,in_R9D);
  return;
}

Assistant:

TEST(Compare) {
  Bignum bignum1;
  Bignum bignum2;
  bignum1.AssignUInt16(1);
  bignum2.AssignUInt16(1);
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));
  CHECK(Bignum::Equal(bignum1, bignum2));
  CHECK(Bignum::LessEqual(bignum1, bignum2));
  CHECK(!Bignum::Less(bignum1, bignum2));

  bignum1.AssignUInt16(0);
  bignum2.AssignUInt16(1);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));
  CHECK(!Bignum::Equal(bignum1, bignum2));
  CHECK(!Bignum::Equal(bignum2, bignum1));
  CHECK(Bignum::LessEqual(bignum1, bignum2));
  CHECK(!Bignum::LessEqual(bignum2, bignum1));
  CHECK(Bignum::Less(bignum1, bignum2));
  CHECK(!Bignum::Less(bignum2, bignum1));

  AssignHexString(&bignum1, "1234567890ABCDEF12345");
  AssignHexString(&bignum2, "1234567890ABCDEF12345");
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));

  AssignHexString(&bignum1, "1234567890ABCDEF12345");
  AssignHexString(&bignum2, "1234567890ABCDEF12346");
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "1234567890ABCDEF12345");
  bignum1.ShiftLeft(500);
  AssignHexString(&bignum2, "1234567890ABCDEF12345");
  bignum2.ShiftLeft(500);
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));

  AssignHexString(&bignum1, "1234567890ABCDEF12345");
  bignum1.ShiftLeft(500);
  AssignHexString(&bignum2, "1234567890ABCDEF12346");
  bignum2.ShiftLeft(500);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  bignum1.AssignUInt16(1);
  bignum1.ShiftLeft(64);
  AssignHexString(&bignum2, "10000000000000000");
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(0, Bignum::Compare(bignum2, bignum1));

  bignum1.AssignUInt16(1);
  bignum1.ShiftLeft(64);
  AssignHexString(&bignum2, "10000000000000001");
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  bignum1.AssignUInt16(1);
  bignum1.ShiftLeft(96);
  AssignHexString(&bignum2, "10000000000000001");
  bignum2.ShiftLeft(32);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "FFFFFFFFFFFFFFFF");
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(64);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "FFFFFFFFFFFFFFFF");
  bignum1.ShiftLeft(32);
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(96);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "FFFFFFFFFFFFFFFF");
  bignum1.ShiftLeft(32);
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(95);
  CHECK_EQ(+1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(-1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "FFFFFFFFFFFFFFFF");
  bignum1.ShiftLeft(32);
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(100);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "100000000000000");
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(14*4);
  CHECK_EQ(0, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(0, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "100000000000001");
  bignum2.AssignUInt16(1);
  bignum2.ShiftLeft(14*4);
  CHECK_EQ(+1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(-1, Bignum::Compare(bignum2, bignum1));

  AssignHexString(&bignum1, "200000000000000");
  bignum2.AssignUInt16(3);
  bignum2.ShiftLeft(14*4);
  CHECK_EQ(-1, Bignum::Compare(bignum1, bignum2));
  CHECK_EQ(+1, Bignum::Compare(bignum2, bignum1));
}